

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O3

al_fixed al_fixsqrt(al_fixed x)

{
  al_fixed aVar1;
  double dVar2;
  
  if (x < 1) {
    aVar1 = 0;
    if (x < 0) {
      al_set_errno(0x21);
    }
  }
  else {
    dVar2 = (double)x * 1.52587890625e-05;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    if (dVar2 <= 32767.0) {
      if (-32767.0 <= dVar2) {
        aVar1 = (al_fixed)(dVar2 * 65536.0 + *(double *)(&DAT_001b08c0 + (ulong)(dVar2 < 0.0) * 8));
      }
      else {
        al_set_errno(0x22);
        aVar1 = -0x7fffffff;
      }
    }
    else {
      al_set_errno(0x22);
      aVar1 = 0x7fffffff;
    }
  }
  return aVar1;
}

Assistant:

al_fixed al_fixsqrt(al_fixed x)
{
   if (x > 0)
      return al_ftofix(sqrt(al_fixtof(x)));

   if (x < 0)
      al_set_errno(EDOM);

   return 0;
}